

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gb_Oscs.cpp
# Opt level: O2

void __thiscall Gb_Wave::run(Gb_Wave *this,blip_time_t time,blip_time_t end_time,int playing)

{
  byte bVar1;
  uint8_t *puVar2;
  Blip_Buffer *buf;
  int iVar3;
  byte bVar4;
  int iVar5;
  int delta;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  
  bVar4 = (char)(this->super_Gb_Osc).volume - 1U & 7;
  puVar2 = (this->super_Gb_Osc).regs;
  uVar9 = (puVar2[4] & 7) * 0x100;
  bVar1 = puVar2[3];
  uVar6 = (bVar1 + uVar9) - 0x7fe;
  uVar7 = 0x1eU >> bVar4 & playing;
  if (0xfffff802 < uVar6) {
    uVar7 = ((uint)(this->wave[this->wave_pos] >> bVar4) & playing) * 2;
  }
  iVar5 = uVar7 - (this->super_Gb_Osc).last_amp;
  if (iVar5 != 0) {
    (this->super_Gb_Osc).last_amp = uVar7;
    Blip_Synth<8,_1>::offset(this->synth,time,iVar5,(this->super_Gb_Osc).output);
  }
  iVar5 = time + (this->super_Gb_Osc).delay;
  if (uVar6 < 0xfffff803) {
    iVar5 = end_time;
  }
  if (playing == 0) {
    iVar5 = end_time;
  }
  if (iVar5 < end_time) {
    buf = (this->super_Gb_Osc).output;
    uVar8 = (ulong)(uint)this->wave_pos;
    do {
      uVar7 = (int)uVar8 + 1U & 0x1f;
      uVar8 = (ulong)uVar7;
      iVar3 = (uint)(this->wave[uVar8] >> bVar4) * 2;
      delta = iVar3 - (this->super_Gb_Osc).last_amp;
      if (delta != 0) {
        (this->super_Gb_Osc).last_amp = iVar3;
        Blip_Synth<8,_1>::offset_inline(this->synth,iVar5,delta,buf);
      }
      iVar5 = iVar5 + (uVar9 | bVar1) * -2 + 0x1000;
    } while (iVar5 < end_time);
    this->wave_pos = uVar7;
  }
  (this->super_Gb_Osc).delay = iVar5 - end_time;
  return;
}

Assistant:

void Gb_Wave::run( blip_time_t time, blip_time_t end_time, int playing )
{
	int volume_shift = (volume - 1) & 7; // volume = 0 causes shift = 7
	int frequency;
	{
		int amp = (wave [wave_pos] >> volume_shift & playing) * 2;
		
		frequency = this->frequency();
		if ( unsigned (frequency - 1) > 2044 ) // frequency < 1 || frequency > 2045
		{
			amp = 30 >> volume_shift & playing;
			playing = false;
		}
		
		int delta = amp - last_amp;
		if ( delta )
		{
			last_amp = amp;
			synth->offset( time, delta, output );
		}
	}
	
	time += delay;
	if ( !playing )
		time = end_time;
	
	if ( time < end_time )
	{
		Blip_Buffer* const output = this->output;
		int const period = (2048 - frequency) * 2;
	 	int wave_pos = (this->wave_pos + 1) & (wave_size - 1);
	 	
		do
		{
			int amp = (wave [wave_pos] >> volume_shift) * 2;
			wave_pos = (wave_pos + 1) & (wave_size - 1);
			int delta = amp - last_amp;
			if ( delta )
			{
				last_amp = amp;
				synth->offset_inline( time, delta, output );
			}
			time += period;
		}
		while ( time < end_time );
		
		this->wave_pos = (wave_pos - 1) & (wave_size - 1);
	}
	delay = time - end_time;
}